

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::_TryMergeDrawCmds(ImDrawList *this)

{
  ImDrawCmd *pIVar1;
  int iVar2;
  long lVar3;
  
  pIVar1 = (this->CmdBuffer).Data;
  lVar3 = (long)(this->CmdBuffer).Size;
  iVar2 = bcmp(pIVar1 + lVar3 + -1,pIVar1 + lVar3 + -2,0x1c);
  if (iVar2 == 0) {
    if (((pIVar1[lVar3 + -2].IdxOffset + pIVar1[lVar3 + -2].ElemCount ==
          pIVar1[lVar3 + -1].IdxOffset) && (pIVar1[lVar3 + -1].UserCallback == (ImDrawCallback)0x0))
       && (pIVar1[lVar3 + -2].UserCallback == (ImDrawCallback)0x0)) {
      pIVar1[lVar3 + -2].ElemCount = pIVar1[lVar3 + -2].ElemCount + pIVar1[lVar3 + -1].ElemCount;
      ImVector<ImDrawCmd>::pop_back(&this->CmdBuffer);
      return;
    }
  }
  return;
}

Assistant:

void ImDrawList::_TryMergeDrawCmds()
{
    IM_ASSERT_PARANOID(CmdBuffer.Size > 0);
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    ImDrawCmd* prev_cmd = curr_cmd - 1;
    if (ImDrawCmd_HeaderCompare(curr_cmd, prev_cmd) == 0 && ImDrawCmd_AreSequentialIdxOffset(prev_cmd, curr_cmd) && curr_cmd->UserCallback == NULL && prev_cmd->UserCallback == NULL)
    {
        prev_cmd->ElemCount += curr_cmd->ElemCount;
        CmdBuffer.pop_back();
    }
}